

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HVectorBase.cpp
# Opt level: O2

void __thiscall
HVectorBase<double>::saxpy<double,HighsCDouble>
          (HVectorBase<double> *this,double pivotX,HVectorBase<HighsCDouble> *pivot)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pHVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  HighsCDouble HVar12;
  HighsCDouble local_40;
  
  iVar7 = this->count;
  piVar2 = (this->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (this->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (pivot->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar5 = (pivot->array).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = 0;
  uVar8 = (ulong)(uint)pivot->count;
  if (pivot->count < 1) {
    uVar8 = uVar9;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    iVar1 = piVar4[uVar9];
    dVar11 = pdVar3[iVar1];
    local_40 = HighsCDouble::operator*(pHVar5 + iVar1,pivotX);
    HVar12 = HighsCDouble::operator+(&local_40,dVar11);
    if ((dVar11 == 0.0) && (!NAN(dVar11))) {
      lVar6 = (long)iVar7;
      iVar7 = iVar7 + 1;
      piVar2[lVar6] = iVar1;
    }
    dVar11 = HVar12.hi + HVar12.lo;
    uVar10 = -(ulong)(ABS(dVar11) < 1e-14);
    pdVar3[iVar1] = (double)(~uVar10 & (ulong)dVar11 | uVar10 & 0x358dee7a4ad4b81f);
  }
  this->count = iVar7;
  return;
}

Assistant:

void HVectorBase<Real>::saxpy(const RealPivX pivotX,
                              const HVectorBase<RealPiv>* pivot) {
  /*
   * Add a multiple pivotX of *pivot into this vector, maintaining
   * indices of nonzeros but not tracking cancellation.
   * The real types may all be different but must mix in operations and be
   * convertible to this HVector's real type.
   */
  HighsInt workCount = count;
  HighsInt* workIndex = &index[0];
  Real* workArray = &array[0];

  const HighsInt pivotCount = pivot->count;
  const HighsInt* pivotIndex = &pivot->index[0];
  const RealPiv* pivotArray = &pivot->array[0];

  using std::abs;
  for (HighsInt k = 0; k < pivotCount; k++) {
    const HighsInt iRow = pivotIndex[k];
    const Real x0 = workArray[iRow];
    const Real x1 = Real(x0 + pivotX * pivotArray[iRow]);
    if (x0 == Real{0}) workIndex[workCount++] = iRow;
    workArray[iRow] = (abs(x1) < kHighsTiny) ? kHighsZero : x1;
  }
  count = workCount;
}